

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O2

Element * Rml::FindFocusElement(Element *element)

{
  ElementDocument *this;
  ComputedValues *pCVar1;
  
  this = Element::GetOwnerDocument(element);
  if ((this != (ElementDocument *)0x0) &&
     (pCVar1 = Element::GetComputedValues(&this->super_Element),
     ((pCVar1->inherited).field_0x15 & 0x40) != 0)) {
    for (; element != (Element *)0x0; element = Element::GetParentNode(element)) {
      pCVar1 = Element::GetComputedValues(element);
      if (((pCVar1->inherited).field_0x15 & 0x40) != 0) {
        return element;
      }
    }
  }
  return (Element *)0x0;
}

Assistant:

static Element* FindFocusElement(Element* element)
{
	ElementDocument* owner_document = element->GetOwnerDocument();
	if (!owner_document || owner_document->GetComputedValues().focus() == Style::Focus::None)
		return nullptr;

	while (element && element->GetComputedValues().focus() == Style::Focus::None)
	{
		element = element->GetParentNode();
	}

	return element;
}